

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Ray *ray)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Ray {",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
  std::ostream::put((char)os);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"start: ",7);
  poVar1 = std::ostream::_M_insert<double>((double)(ray->start).field_0.field_0.x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>((double)(ray->start).field_0.field_0.y);
  poVar1 = std::ostream::_M_insert<double>((double)(ray->start).field_0.field_0.z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," direction: ",0xc);
  poVar1 = std::ostream::_M_insert<double>((double)(ray->direction).field_0.field_0.x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::ostream::_M_insert<double>((double)(ray->direction).field_0.field_0.y);
  poVar1 = std::ostream::_M_insert<double>((double)(ray->direction).field_0.field_0.z);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Ray &ray) {
    os << "Ray {"<<std::endl<<"start: " << ray.start.x <<" "<< ray.start.y << ray.start.z << " direction: " <<  ray.direction.x <<" "<< ray.direction.y << ray.direction.z<<std::endl<<"}"<<std::endl;
    return os;
}